

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__extend_receive(stbi__jpeg *j,int n)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ESI;
  long in_RDI;
  int sgn;
  uint k;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x4824) < in_ESI) {
    stbi__grow_buffer_unsafe((stbi__jpeg *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  iVar1 = *(int *)(in_RDI + 0x4820);
  uVar3 = *(int *)(in_RDI + 0x4820) << ((byte)in_ESI & 0x1f) |
          *(uint *)(in_RDI + 0x4820) >> (-(byte)in_ESI & 0x1f);
  *(uint *)(in_RDI + 0x4820) = uVar3 & (stbi__bmask[in_ESI] ^ 0xffffffff);
  uVar2 = stbi__bmask[in_ESI];
  *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) - in_ESI;
  return (uVar2 & uVar3) + (stbi__jbias[in_ESI] & 0xffffffffU - (iVar1 >> 0x1f));
}

Assistant:

stbi_inline static int stbi__extend_receive(stbi__jpeg *j, int n)
{
   unsigned int k;
   int sgn;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);

   sgn = j->code_buffer >> 31; // sign bit always in MSB; 0 if MSB clear (positive), 1 if MSB set (negative)
   k = stbi_lrot(j->code_buffer, n);
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k + (stbi__jbias[n] & (sgn - 1));
}